

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_vhost.c
# Opt level: O2

int mk_vhost_map_handlers(mk_server *server)

{
  mk_list *pmVar1;
  mk_list *pmVar2;
  mk_plugin *pmVar3;
  mk_list *pmVar4;
  int iVar5;
  char *format;
  
  pmVar1 = &server->hosts;
  iVar5 = 0;
LAB_00106a63:
  pmVar1 = pmVar1->next;
  if (pmVar1 == &server->hosts) {
    return iVar5;
  }
  pmVar2 = pmVar1 + -1;
LAB_00106a75:
  do {
    pmVar2 = pmVar2->next;
    if (pmVar2 == pmVar1 + -1) goto LAB_00106a63;
    pmVar3 = mk_plugin_lookup((char *)pmVar2[-4].next,server);
    if (pmVar3 == (mk_plugin *)0x0) {
      pmVar4 = pmVar2[-4].next;
      format = "Plugin \'%s\' was not loaded";
    }
    else {
      if (pmVar3->hooks == 0x100) {
        pmVar2[-1].next = (mk_list *)pmVar3;
        iVar5 = iVar5 + 1;
        goto LAB_00106a75;
      }
      pmVar4 = pmVar2[-4].next;
      format = "Plugin \'%s\' is not a handler";
    }
    mk_print(0x1001,format,pmVar4);
  } while( true );
}

Assistant:

int mk_vhost_map_handlers(struct mk_server *server)
{
    int n = 0;
    struct mk_list *head;
    struct mk_list *head_handler;
    struct mk_vhost *host;
    struct mk_vhost_handler *h_handler;
    struct mk_plugin *p;

    mk_list_foreach(head, &server->hosts) {
        host = mk_list_entry(head, struct mk_vhost, _head);
        mk_list_foreach(head_handler, &host->handlers) {
            h_handler = mk_list_entry(head_handler,
                                      struct mk_vhost_handler, _head);

            /* Lookup plugin by name */
            p = mk_plugin_lookup(h_handler->name, server);
            if (!p) {
                mk_err("Plugin '%s' was not loaded", h_handler->name);
                continue;
            }

            if (p->hooks != MK_PLUGIN_STAGE) {
                mk_err("Plugin '%s' is not a handler", h_handler->name);
                continue;
            }

            h_handler->handler = p;
            n++;
        }
    }

    return n;
}